

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.cc
# Opt level: O2

void __thiscall
google::protobuf::internal::ArenaImpl::AddCleanupFallback
          (ArenaImpl *this,void *elem,_func_void_void_ptr *cleanup)

{
  SerialArena *this_00;
  
  this_00 = GetSerialArena(this);
  SerialArena::AddCleanup(this_00,elem,cleanup);
  return;
}

Assistant:

PROTOBUF_NOINLINE
void ArenaImpl::AddCleanupFallback(void* elem, void (*cleanup)(void*)) {
  GetSerialArena()->AddCleanup(elem, cleanup);
}